

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase228::run(TestCase228 *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t __n;
  void *__buf;
  void *__buf_00;
  int iVar2;
  ReaderOptions receiveOptions;
  int handleCount;
  Fault f;
  Own<capnp::ClientHook> OStack_310;
  WirePointer *pWStack_300;
  PipelineOp *local_2f8;
  undefined1 auStack_2f0 [24];
  RpcSystem<capnp::rpc::twoparty::VatId> rpcClient;
  int callCount;
  AsyncIoContext ioContext;
  Client client;
  Client handle1;
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> promise;
  Client handle2;
  Own<capnp::RequestHook> local_200;
  PipeThread serverThread;
  Maybe<capnp::MessageSize> local_1d0;
  Maybe<capnp::MessageSize> local_1b8;
  TwoPartyVatNetwork network;
  
  kj::setupAsyncIo();
  callCount = 0;
  handleCount = 0;
  runServer(&serverThread,ioContext.provider.ptr,&callCount,&handleCount);
  iVar2 = 0x40;
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  __n = 0x800000;
  TwoPartyVatNetwork::TwoPartyVatNetwork(&network,serverThread.pipe.ptr,CLIENT,receiveOptions);
  makeRpcClient<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&rpcClient,&network.super_TwoPartyVatNetworkBase);
  getPersistentCap((RpcSystem<capnp::rpc::twoparty::VatId> *)&f,(Side)&rpcClient,TEST_MORE_STUFF);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMoreStuff>(&client,(Client *)&f);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&f);
  local_1b8.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::getHandleRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
              *)&handle2,&client,&local_1b8);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
          *)&promise,(int)&handle2,__buf,__n,iVar2);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>
              *)&f,&promise);
  capnproto_test::capnp::test::TestMoreStuff::GetHandleResults::Reader::getHandle
            (&handle1,(Reader *)&f);
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)(auStack_2f0 + 8));
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::~RemotePromise
            (&promise);
  kj::Own<capnp::RequestHook>::dispose(&local_200);
  local_1d0.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::getHandleRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
              *)&f,&client,&local_1d0);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
          *)&promise,(int)&f,__buf_00,__n,iVar2);
  kj::Own<capnp::RequestHook>::dispose((Own<capnp::RequestHook> *)auStack_2f0);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>_>
              *)&f,&promise);
  capnproto_test::capnp::test::TestMoreStuff::GetHandleResults::Reader::getHandle
            (&handle2,(Reader *)&f);
  kj::Own<capnp::ResponseHook>::dispose((Own<capnp::ResponseHook> *)(auStack_2f0 + 8));
  if ((handleCount != 2) && (kj::_::Debug::minSeverity < 3)) {
    f.exception._0_4_ = 2;
    kj::_::Debug::log<char_const(&)[38],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0xf5,ERROR,"\"failed: expected \" \"(2) == (handleCount)\", 2, handleCount",
               (char (*) [38])"failed: expected (2) == (handleCount)",(int *)&f,&handleCount);
  }
  capnproto_test::capnp::test::TestHandle::Client::Client((Client *)&f,(void *)0x0);
  capnproto_test::capnp::test::TestHandle::Client::operator=(&handle1,(Client *)&f);
  kj::Own<capnp::ClientHook>::dispose(&OStack_310);
  iVar2 = -1000;
  do {
    if (handleCount < 2) {
      if ((handleCount != 1) && (kj::_::Debug::minSeverity < 3)) {
        f.exception._0_4_ = 1;
        kj::_::Debug::log<char_const(&)[38],int,int&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                   ,0x109,ERROR,"\"failed: expected \" \"(1) == (handleCount)\", 1, handleCount",
                   (char (*) [38])"failed: expected (1) == (handleCount)",(int *)&f,&handleCount);
      }
      capnproto_test::capnp::test::TestHandle::Client::Client((Client *)&f,(void *)0x0);
      capnproto_test::capnp::test::TestHandle::Client::operator=(&handle2,(Client *)&f);
      kj::Own<capnp::ClientHook>::dispose(&OStack_310);
      iVar1 = (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[5])();
      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x10))
                (&f,(long *)CONCAT44(extraout_var_00,iVar1),10000000);
      kj::Promise<void>::wait((Promise<void> *)&f,ioContext.waitScope);
      kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
      if ((handleCount != 1) && (kj::_::Debug::minSeverity < 3)) {
        f.exception._0_4_ = 1;
        kj::_::Debug::log<char_const(&)[38],int,int&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                   ,0x10e,ERROR,"\"failed: expected \" \"(1) == (handleCount)\", 1, handleCount",
                   (char (*) [38])"failed: expected (1) == (handleCount)",(int *)&f,&handleCount);
      }
      local_2f8 = (PipelineOp *)0x0;
      auStack_2f0._0_8_ = (Disposer *)0x0;
      OStack_310.ptr = (ClientHook *)0x0;
      pWStack_300 = (WirePointer *)0x0;
      f.exception = (Exception *)0x0;
      OStack_310.disposer = (Disposer *)0x0;
      auStack_2f0._8_8_ = (ArrayDisposer *)0x0;
      RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::operator=
                (&promise,(RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
                           *)&f);
      RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::~RemotePromise
                ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults> *)&f);
      do {
        if (handleCount < 1) {
          if ((handleCount != 0) && (kj::_::Debug::minSeverity < 3)) {
            f.exception = f.exception & 0xffffffff00000000;
            kj::_::Debug::log<char_const(&)[38],int,int&>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                       ,0x116,ERROR,"\"failed: expected \" \"(0) == (handleCount)\", 0, handleCount"
                       ,(char (*) [38])"failed: expected (0) == (handleCount)",(int *)&f,
                       &handleCount);
          }
          kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&handle2.field_0x8);
          RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>::
          ~RemotePromise(&promise);
          kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&handle1.field_0x8);
          kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client.field_0x8);
          RpcSystemBase::~RpcSystemBase(&rpcClient.super_RpcSystemBase);
          TwoPartyVatNetwork::~TwoPartyVatNetwork(&network);
          kj::AsyncIoProvider::PipeThread::~PipeThread(&serverThread);
          kj::AsyncIoContext::~AsyncIoContext(&ioContext);
          return;
        }
        iVar1 = (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[5])();
        (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x10))
                  ((Own<kj::_::PromiseNode> *)&f,(long *)CONCAT44(extraout_var_01,iVar1),10000000);
        kj::Promise<void>::wait((Promise<void> *)&f,ioContext.waitScope);
        kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
        iVar2 = iVar2 + 1;
      } while (iVar2 != 0);
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x114,FAILED,"--maxSpins > 0","");
      kj::_::Debug::Fault::fatal(&f);
    }
    iVar1 = (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[5])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))
              ((Own<kj::_::PromiseNode> *)&f,(long *)CONCAT44(extraout_var,iVar1),10000000);
    kj::Promise<void>::wait((Promise<void> *)&f,ioContext.waitScope);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0);
  kj::_::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
             ,0x107,FAILED,"--maxSpins > 0","");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(TwoPartyNetwork, Release) {
  auto ioContext = kj::setupAsyncIo();
  int callCount = 0;
  int handleCount = 0;

  auto serverThread = runServer(*ioContext.provider, callCount, handleCount);
  TwoPartyVatNetwork network(*serverThread.pipe, rpc::twoparty::Side::CLIENT);
  auto rpcClient = makeRpcClient(network);

  // Request the particular capability from the server.
  auto client = getPersistentCap(rpcClient, rpc::twoparty::Side::SERVER,
      test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF).castAs<test::TestMoreStuff>();

  auto handle1 = client.getHandleRequest().send().wait(ioContext.waitScope).getHandle();
  auto promise = client.getHandleRequest().send();
  auto handle2 = promise.wait(ioContext.waitScope).getHandle();

  EXPECT_EQ(2, handleCount);

  handle1 = nullptr;

  // There once was a bug where the last outgoing message (and any capabilities attached) would
  // not get cleaned up (until a new message was sent). This appeared to be a bug in Release,
  // becaues if a client received a message and then released a capability from it but then did
  // not make any further calls, then the capability would not be released because the message
  // introducing it remained the last server -> client message (because a "Release" message has
  // no reply). Here we are explicitly trying to catch this bug. This proves tricky, because when
  // we drop a reference on the client side, there's no particular way to wait for the release
  // message to reach the server except to make a subsequent call and wait for the return -- but
  // that would mask the bug. So, we wait spin waiting for handleCount to change.

  uint maxSpins = 1000;

  while (handleCount > 1) {
    ioContext.provider->getTimer().afterDelay(10 * kj::MILLISECONDS).wait(ioContext.waitScope);
    KJ_ASSERT(--maxSpins > 0);
  }
  EXPECT_EQ(1, handleCount);

  handle2 = nullptr;

  ioContext.provider->getTimer().afterDelay(10 * kj::MILLISECONDS).wait(ioContext.waitScope);
  EXPECT_EQ(1, handleCount);

  promise = nullptr;

  while (handleCount > 0) {
    ioContext.provider->getTimer().afterDelay(10 * kj::MILLISECONDS).wait(ioContext.waitScope);
    KJ_ASSERT(--maxSpins > 0);
  }
  EXPECT_EQ(0, handleCount);
}